

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

char * flatcc_json_parser_union_vector
                 (flatcc_json_parser_t *ctx,char *buf,char *end,size_t union_index,
                 flatbuffers_voffset_t id,size_t handle,flatcc_json_parser_union_f *union_parser)

{
  void *pvVar1;
  long *plVar2;
  __flatcc_json_parser_union_entry_t *e;
  __flatcc_json_parser_union_frame_t *f;
  size_t handle_local;
  flatbuffers_voffset_t id_local;
  size_t union_index_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  pvVar1 = flatcc_builder_get_user_frame_ptr(ctx->ctx,handle);
  plVar2 = (long *)((long)pvVar1 + union_index * 0x28 + 0x10);
  if (*plVar2 == 0) {
    if (*(char *)((long)plVar2 + 0x14) == '\0') {
      *(long *)((long)pvVar1 + 8) = *(long *)((long)pvVar1 + 8) + 1;
      *(int *)(plVar2 + 2) = ctx->line;
      plVar2[1] = (long)ctx->line_start;
      *plVar2 = (long)buf;
      end_local = flatcc_json_parser_generic_json(ctx,buf,end);
    }
    else {
      *(long *)((long)pvVar1 + 8) = *(long *)((long)pvVar1 + 8) + -1;
      end_local = _parse_union_vector(ctx,buf,end,plVar2[4],*(flatbuffers_uoffset_t *)(plVar2 + 3),
                                      id,union_parser);
    }
    ctx_local = (flatcc_json_parser_t *)end_local;
  }
  else {
    ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,buf,end,0x1c);
  }
  return (char *)ctx_local;
}

Assistant:

const char *flatcc_json_parser_union_vector(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, size_t union_index,
        flatbuffers_voffset_t id, size_t handle, flatcc_json_parser_union_f *union_parser)
{
    __flatcc_json_parser_union_frame_t *f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    __flatcc_json_parser_union_entry_t *e = f->unions + union_index;

    if (e->backtrace) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_duplicate);
    }
    if (!e->type_present) {
        ++f->union_count;
        e->line = ctx->line;
        e->line_start = ctx->line_start;
        buf = flatcc_json_parser_generic_json(ctx, (e->backtrace = buf), end);
    } else {
        --f->union_count;
        buf = _parse_union_vector(ctx, buf, end, e->h_types, e->count, id, union_parser);
    }
    return buf;
}